

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

bool __thiscall
QSslSocket::setSocketDescriptor
          (QSslSocket *this,qintptr socketDescriptor,SocketState state,OpenMode openMode)

{
  QSslSocketPrivate *this_00;
  undefined1 uVar1;
  quint16 qVar2;
  SocketError errorCode;
  undefined4 uVar3;
  qintptr qVar4;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSslSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if (this_00->plainSocket == (QTcpSocket *)0x0) {
    QSslSocketPrivate::createPlainSocket(this_00,openMode);
  }
  uVar1 = (**(code **)(*(long *)&this_00->plainSocket->super_QAbstractSocket + 0x118))
                    (this_00->plainSocket,socketDescriptor,state,
                     openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                     super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  qVar4 = (**(code **)(*(long *)&this_00->plainSocket->super_QAbstractSocket + 0x110))();
  (this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.cachedSocketDescriptor = qVar4;
  errorCode = QAbstractSocket::error(&this_00->plainSocket->super_QAbstractSocket);
  QIODevice::errorString();
  QAbstractSocketPrivate::setError((QAbstractSocketPrivate *)this_00,errorCode,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  QAbstractSocket::setSocketState((QAbstractSocket *)this,state);
  QIODevice::setOpenMode
            (this,openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  qVar2 = QAbstractSocket::localPort(&this_00->plainSocket->super_QAbstractSocket);
  QAbstractSocket::setLocalPort((QAbstractSocket *)this,qVar2);
  QAbstractSocket::localAddress((QAbstractSocket *)&local_50);
  QAbstractSocket::setLocalAddress((QAbstractSocket *)this,(QHostAddress *)&local_50);
  QHostAddress::~QHostAddress((QHostAddress *)&local_50);
  qVar2 = QAbstractSocket::peerPort(&this_00->plainSocket->super_QAbstractSocket);
  QAbstractSocket::setPeerPort((QAbstractSocket *)this,qVar2);
  QAbstractSocket::peerAddress((QAbstractSocket *)&local_50);
  QAbstractSocket::setPeerAddress((QAbstractSocket *)this,(QHostAddress *)&local_50);
  QHostAddress::~QHostAddress((QHostAddress *)&local_50);
  QAbstractSocket::peerName(&local_50,&this_00->plainSocket->super_QAbstractSocket);
  QAbstractSocket::setPeerName((QAbstractSocket *)this,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  uVar3 = QIODevice::readChannelCount();
  *(undefined4 *)&(this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xa8 = uVar3
  ;
  uVar3 = QIODevice::writeChannelCount();
  *(undefined4 *)&(this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xac = uVar3
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::setSocketDescriptor(qintptr socketDescriptor, SocketState state, OpenMode openMode)
{
    Q_D(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::setSocketDescriptor(" << socketDescriptor << ','
             << state << ',' << openMode << ')';
#endif
    if (!d->plainSocket)
        d->createPlainSocket(openMode);
    bool retVal = d->plainSocket->setSocketDescriptor(socketDescriptor, state, openMode);
    d->cachedSocketDescriptor = d->plainSocket->socketDescriptor();
    d->setError(d->plainSocket->error(), d->plainSocket->errorString());
    setSocketState(state);
    setOpenMode(openMode);
    setLocalPort(d->plainSocket->localPort());
    setLocalAddress(d->plainSocket->localAddress());
    setPeerPort(d->plainSocket->peerPort());
    setPeerAddress(d->plainSocket->peerAddress());
    setPeerName(d->plainSocket->peerName());
    d->readChannelCount = d->plainSocket->readChannelCount();
    d->writeChannelCount = d->plainSocket->writeChannelCount();
    return retVal;
}